

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterable_feature.cc
# Opt level: O2

ostream * range_to_stream<ezy::strong_type<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>const>>>>>>,void,ezy::features::iterable>>
                    (ostream *ostr,
                    strong_type<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_void,_ezy::features::iterable>
                    *range)

{
  ostream *poVar1;
  ostream *poVar2;
  const_iterator __begin0;
  take_iterator<const_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  local_38;
  
  std::operator<<((ostream *)ostr,"[");
  local_38.tracker.iters.
  super__Tuple_impl<0UL,_ezy::detail::cycle_iterator<const_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>
  .
  super__Head_base<0UL,_ezy::detail::cycle_iterator<const_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>,_false>
  ._M_head_impl.tracker.ranges.
  super__Tuple_impl<0UL,_std::reference_wrapper<const_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::reference_wrapper<const_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>,_false>
  ._M_head_impl._M_data =
       (_Tuple_impl<0UL,_std::reference_wrapper<const_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>
        )&(range->
          super_strong_type_base<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_true>
          ).
          super_strong_type_payload<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_true>
          ._value.range.t;
  local_38.n = (range->
               super_strong_type_base<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_true>
               ).
               super_strong_type_payload<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_true>
               ._value.n;
  local_38.tracker.iters.
  super__Tuple_impl<0UL,_ezy::detail::cycle_iterator<const_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>
  .
  super__Head_base<0UL,_ezy::detail::cycle_iterator<const_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>,_false>
  ._M_head_impl.tracker.current.
  super__Tuple_impl<0UL,_ezy::detail::take_iterator<const_std::vector<int,_std::allocator<int>_>_>_>
  .
  super__Head_base<0UL,_ezy::detail::take_iterator<const_std::vector<int,_std::allocator<int>_>_>,_false>
  ._M_head_impl.n =
       *(size_type *)
        ((long)&(range->
                super_strong_type_base<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_true>
                ).
                super_strong_type_payload<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_true>
                ._value.range.t.range.t + 8);
  local_38.tracker.iters.
  super__Tuple_impl<0UL,_ezy::detail::cycle_iterator<const_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>
  .
  super__Head_base<0UL,_ezy::detail::cycle_iterator<const_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>,_false>
  ._M_head_impl.tracker.current.
  super__Tuple_impl<0UL,_ezy::detail::take_iterator<const_std::vector<int,_std::allocator<int>_>_>_>
  .
  super__Head_base<0UL,_ezy::detail::take_iterator<const_std::vector<int,_std::allocator<int>_>_>,_false>
  ._M_head_impl.tracker.iters.
  super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  .
  super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
  ._M_head_impl._M_current =
       (tuple<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>)
       (((range->
         super_strong_type_base<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_true>
         ).
         super_strong_type_payload<ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>,_true>
         ._value.range.t.range.t.range.t)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  while (local_38.n != 0) {
    poVar1 = element_to_stream<int>
                       (ostr,(int *)local_38.tracker.iters.
                                    super__Tuple_impl<0UL,_ezy::detail::cycle_iterator<const_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>
                                    .
                                    super__Head_base<0UL,_ezy::detail::cycle_iterator<const_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>,_false>
                                    ._M_head_impl.tracker.current.
                                    super__Tuple_impl<0UL,_ezy::detail::take_iterator<const_std::vector<int,_std::allocator<int>_>_>_>
                                    .
                                    super__Head_base<0UL,_ezy::detail::take_iterator<const_std::vector<int,_std::allocator<int>_>_>,_false>
                                    ._M_head_impl.tracker.iters.
                                    super__Tuple_impl<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                                    .
                                    super__Head_base<0UL,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_false>
                                    ._M_head_impl._M_current);
    std::operator<<((ostream *)poVar1,", ");
    ezy::detail::
    take_iterator<const_ezy::detail::cycle_view<ezy::experimental::keeper<ezy::experimental::owner_category_tag,_ezy::detail::take_n_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
    ::operator++(&local_38);
  }
  poVar2 = std::operator<<((ostream *)ostr,"]");
  return (ostream *)poVar2;
}

Assistant:

std::ostream& range_to_stream(std::ostream& ostr, const RangeType& range)
{
  ostr << "[";
  for (const auto& e : range)
    element_to_stream(ostr, e) << ", ";

  return ostr << "]";
}